

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O3

void __thiscall
icu_63::CollationFastLatinBuilder::addUniqueCE
          (CollationFastLatinBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  uint uVar1;
  
  if ((((int)((ulong)ce >> 0x20) != 1) && (ce != 0)) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    uVar1 = anon_unknown_8::binarySearch
                      ((this->uniqueCEs).elements,(this->uniqueCEs).count,ce & 0xffffffffffff3fffU);
    if ((int)uVar1 < 0) {
      UVector64::insertElementAt(&this->uniqueCEs,ce & 0xffffffffffff3fffU,~uVar1,errorCode);
      return;
    }
  }
  return;
}

Assistant:

void
CollationFastLatinBuilder::addUniqueCE(int64_t ce, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(ce == 0 || (uint32_t)(ce >> 32) == Collation::NO_CE_PRIMARY) { return; }
    ce &= ~(int64_t)Collation::CASE_MASK;  // blank out case bits
    int32_t i = binarySearch(uniqueCEs.getBuffer(), uniqueCEs.size(), ce);
    if(i < 0) {
        uniqueCEs.insertElementAt(ce, ~i, errorCode);
    }
}